

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::FocusWindow(ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiID IVar3;
  ImGuiWindow *window_00;
  bool bVar4;
  
  pIVar2 = GImGui;
  if (GImGui->NavWindow != window) {
    GImGui->NavWindow = window;
    if (window == (ImGuiWindow *)0x0) {
      pIVar2->NavInitRequest = false;
      IVar3 = 0;
    }
    else {
      if (pIVar2->NavDisableMouseHover == true) {
        pIVar2->NavMousePosDirty = true;
      }
      pIVar2->NavInitRequest = false;
      IVar3 = window->NavLastIds[0];
    }
    pIVar2->NavId = IVar3;
    pIVar2->NavIdIsAlive = false;
    pIVar2->NavLayer = ImGuiNavLayer_Main;
  }
  ClosePopupsOverWindow(window,false);
  pIVar1 = GImGui;
  if (window != (ImGuiWindow *)0x0) {
    window_00 = window->RootWindow;
    if (window->RootWindow == (ImGuiWindow *)0x0) {
      window_00 = window;
    }
    if (((((window_00->Flags & 0x4000000) != 0) && (pIVar2->ActiveId != 0)) &&
        (pIVar2->ActiveIdWindow != (ImGuiWindow *)0x0)) &&
       (pIVar2->ActiveIdWindow->RootWindow != window_00)) {
      bVar4 = GImGui->ActiveId != 0;
      GImGui->ActiveIdIsJustActivated = bVar4;
      if (bVar4) {
        pIVar1->ActiveIdTimer = 0.0;
        pIVar1->ActiveIdHasBeenPressedBefore = false;
        pIVar1->ActiveIdHasBeenEditedBefore = false;
      }
      pIVar1->ActiveId = 0;
      pIVar1->ActiveIdAllowNavDirFlags = 0;
      pIVar1->ActiveIdBlockNavInputFlags = 0;
      pIVar1->ActiveIdAllowOverlap = false;
      pIVar1->ActiveIdWindow = (ImGuiWindow *)0x0;
      pIVar1->ActiveIdHasBeenEditedThisFrame = false;
    }
    BringWindowToFocusFront(window_00);
    if ((window_00->Flags & 0x2000) == 0) {
      BringWindowToDisplayFront(window_00);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::FocusWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    if (g.NavWindow != window)
    {
        g.NavWindow = window;
        if (window && g.NavDisableMouseHover)
            g.NavMousePosDirty = true;
        g.NavInitRequest = false;
        g.NavId = window ? window->NavLastIds[0] : 0; // Restore NavId
        g.NavIdIsAlive = false;
        g.NavLayer = ImGuiNavLayer_Main;
        //IMGUI_DEBUG_LOG("FocusWindow(\"%s\")\n", window ? window->Name : NULL);
    }

    // Close popups if any
    ClosePopupsOverWindow(window, false);

    // Passing NULL allow to disable keyboard focus
    if (!window)
        return;

    // Move the root window to the top of the pile
    if (window->RootWindow)
        window = window->RootWindow;

    // Steal focus on active widgets
    if (window->Flags & ImGuiWindowFlags_Popup) // FIXME: This statement should be unnecessary. Need further testing before removing it..
        if (g.ActiveId != 0 && g.ActiveIdWindow && g.ActiveIdWindow->RootWindow != window)
            ClearActiveID();

    // Bring to front
    BringWindowToFocusFront(window);
    if (!(window->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus))
        BringWindowToDisplayFront(window);
}